

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O2

void keepdogs(int exclude,char *pet_msg_suffix)

{
  monst *pmVar1;
  boolean bVar2;
  xchar tolev;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  monst *pmVar6;
  char *line;
  uchar uVar7;
  monst *mon;
  obj *obj;
  char *local_38;
  
  pmVar1 = level->monlist;
  local_38 = pet_msg_suffix;
LAB_00170089:
  do {
    while( true ) {
      do {
        mon = pmVar1;
        if (mon == (monst *)0x0) {
          return;
        }
        pmVar1 = mon->nmon;
      } while ((mon->mhp < 1) || ((exclude == 1 && (mon->mtame == '\0'))));
      bVar2 = monnear(mon,(int)u.ux,(int)u.uy);
      if (bVar2 == '\0') break;
      bVar2 = levl_follower(mon);
      pmVar6 = u.usteed;
      if (mon != u.usteed && bVar2 == '\0') goto LAB_001700f2;
LAB_00170111:
      uVar3 = *(uint *)&mon->field_0x60;
      if ((mon != pmVar6 && (uVar3 & 0xc0000) != 0x40000) || ((mon->mstrategy & 0x20000000) != 0))
      goto LAB_00170184;
      if (mon->mtame == '\0') {
LAB_00170220:
        iVar4 = mon_has_amulet(mon);
        if (iVar4 != 0) {
          if (mon->wormno == '\0') {
            if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00170334;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017032b;
              }
              else {
LAB_0017032b:
                if (ublindf == (obj *)0x0) goto LAB_0017051d;
LAB_00170334:
                if (ublindf->oartifact != '\x1d') goto LAB_0017051d;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  ((viz_array[mon->my][mon->mx] & 1U) == 0)) || ((mon->data->mflags3 & 0x200) == 0))
              goto LAB_0017051d;
            }
          }
          else {
            bVar2 = worm_known(level,mon);
            if (bVar2 == '\0') goto LAB_0017051d;
          }
          uVar3 = *(uint *)&mon->field_0x60;
          if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar3 & 0x280) == 0) goto LAB_001704fb;
          }
          else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001704fb:
            if ((u._1052_1_ & 0x20) == 0) {
              pcVar5 = Monnam(mon);
              line = "%s seems very disoriented for a moment.";
              goto LAB_00170513;
            }
          }
          goto LAB_0017051d;
        }
        if ((mon->mtame != '\0') && (uVar3 = *(uint *)&mon->field_0x60, (uVar3 >> 0x17 & 1) != 0)) {
          if (mon->wormno == '\0') {
            if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00170453;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0017044a;
              }
              else {
LAB_0017044a:
                if (ublindf == (obj *)0x0) goto LAB_0017051d;
LAB_00170453:
                if (ublindf->oartifact != '\x1d') goto LAB_0017051d;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  ((viz_array[mon->my][mon->mx] & 1U) == 0)) || ((mon->data->mflags3 & 0x200) == 0))
              goto LAB_0017051d;
            }
          }
          else {
            bVar2 = worm_known(level,mon);
            if (bVar2 == '\0') goto LAB_0017051d;
            uVar3 = *(uint *)&mon->field_0x60;
          }
          if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar3 & 0x280) == 0) goto LAB_001706ce;
          }
          else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001706ce:
            if ((u._1052_1_ & 0x20) == 0) {
              pcVar5 = Monnam(mon);
              line = "%s is still trapped.";
              goto LAB_00170513;
            }
          }
          goto LAB_0017051d;
        }
LAB_0017056a:
        if ((mon->field_0x63 & 2) != 0) {
          set_residency(mon,'\x01');
        }
        if (mon->wormno == '\0') {
          uVar7 = '\0';
        }
        else {
          iVar4 = count_wsegs(mon);
          uVar7 = (uchar)iVar4;
          if (0x1e < iVar4) {
            uVar7 = '\x1f';
          }
          wormgone(mon);
        }
        obj = (obj *)&mon->minvent;
        while (obj = obj->nobj, obj != (obj *)0x0) {
          if (obj->cobj != (obj *)0x0) {
            picked_container(obj);
          }
          obj->field_0x4a = obj->field_0x4a & 0xf7;
        }
        relmon(mon);
        newsym((int)mon->mx,(int)mon->my);
        mon->mx = '\0';
        mon->my = '\0';
        mon->wormno = uVar7;
        mon->mlstmv = moves;
        mon->nmon = mydogs;
        mydogs = mon;
      }
      else {
        if (mon->meating == 0) {
          if (exclude != 2) goto LAB_00170220;
          if (local_38 == (char *)0x0) {
            local_38 = "remains behind.";
          }
          pcVar5 = Monnam(mon);
          pline("%s %s",pcVar5,local_38);
          goto LAB_0017051d;
        }
        if (mon->wormno == '\0') {
          if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001702e4;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001702db;
            }
            else {
LAB_001702db:
              if (ublindf == (obj *)0x0) goto LAB_0017051d;
LAB_001702e4:
              if (ublindf->oartifact != '\x1d') goto LAB_0017051d;
            }
            if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                 (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                ((viz_array[mon->my][mon->mx] & 1U) == 0)) || ((mon->data->mflags3 & 0x200) == 0))
            goto LAB_0017051d;
          }
        }
        else {
          bVar2 = worm_known(level,mon);
          if (bVar2 == '\0') goto LAB_0017051d;
          uVar3 = *(uint *)&mon->field_0x60;
        }
        if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar3 & 0x280) == 0) goto LAB_001703ec;
        }
        else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001703ec:
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar5 = Monnam(mon);
            line = "%s is still eating.";
LAB_00170513:
            pline(line,pcVar5);
          }
        }
LAB_0017051d:
        if (mon == u.usteed) goto LAB_0017056a;
        if ((*(uint *)&mon->field_0x60 >> 0x18 & 1) != 0) {
          pcVar5 = "%s leash suddenly comes loose.";
LAB_001701aa:
          pline(pcVar5);
          m_unleash(mon,'\0');
        }
      }
    }
    pmVar6 = mon;
    if (mon == u.usteed) goto LAB_00170111;
LAB_001700f2:
    uVar3 = *(uint *)&mon->field_0x60;
    if (((u.uhave._0_1_ & 1) != 0) && (pmVar6 = u.usteed, (uVar3 & 0x20000000) != 0))
    goto LAB_00170111;
LAB_00170184:
    if ((uVar3 >> 0x1d & 1) != 0) {
      tolev = ledger_no(&u.uz);
      migrate_to_level(mon,tolev,'\x02',(coord *)0x0);
      goto LAB_00170089;
    }
    if ((uVar3 >> 0x18 & 1) != 0) {
      pcVar5 = Monnam(mon);
      s_suffix(pcVar5);
      pcVar5 = "%s leash goes slack.";
      goto LAB_001701aa;
    }
  } while( true );
}

Assistant:

void keepdogs(int exclude, const char *pet_msg_suffix)
{
	struct monst *mtmp, *mtmp2;
	struct obj *obj;
	int num_segs;
	boolean stay_behind;
	boolean pets_only = (exclude == 1) ? TRUE : FALSE;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp2) {
	    mtmp2 = mtmp->nmon;
	    if (DEADMONSTER(mtmp)) continue;
	    if (pets_only && !mtmp->mtame) continue;
	    if (((monnear(mtmp, u.ux, u.uy) && levl_follower(mtmp)) ||
			(mtmp == u.usteed) ||
		/* the wiz will level t-port from anywhere to chase
		   the amulet; if you don't have it, will chase you
		   only if in range. -3. */
			(u.uhave.amulet && mtmp->iswiz))
		&& ((!mtmp->msleeping && mtmp->mcanmove)
		    /* eg if level teleport or new trap, steed has no control
		       to avoid following */
		    || (mtmp == u.usteed))
		/* monster won't follow if it hasn't noticed you yet */
		&& !(mtmp->mstrategy & STRAT_WAITFORU)) {
		stay_behind = FALSE;
		if (mtmp->mtame && mtmp->meating) {
			if (canseemon(level, mtmp))
			    pline("%s is still eating.", Monnam(mtmp));
			stay_behind = TRUE;
		} else if (mtmp->mtame && exclude == 2) {
			if (pet_msg_suffix == NULL)
			    pet_msg_suffix = "remains behind.";
			pline("%s %s", Monnam(mtmp), pet_msg_suffix);
			stay_behind = TRUE;
		} else if (mon_has_amulet(mtmp)) {
			if (canseemon(level, mtmp))
			    pline("%s seems very disoriented for a moment.",
				Monnam(mtmp));
			stay_behind = TRUE;
		} else if (mtmp->mtame && mtmp->mtrapped) {
			if (canseemon(level, mtmp))
			    pline("%s is still trapped.", Monnam(mtmp));
			stay_behind = TRUE;
		}
		if (mtmp == u.usteed)
			stay_behind = FALSE;
		
		if (stay_behind) {
			if (mtmp->mleashed) {
				pline("%s leash suddenly comes loose.",
					humanoid(mtmp->data)
					    ? (mtmp->female ? "Her" : "His")
					    : "Its");
				m_unleash(mtmp, FALSE);
			}
			continue;
		}
		if (mtmp->isshk)
			set_residency(mtmp, TRUE);

		if (mtmp->wormno) {
		    int cnt;
		    /* NOTE: worm is truncated to # segs = max wormno size */
		    cnt = count_wsegs(mtmp);
		    num_segs = min(cnt, MAX_NUM_WORMS - 1);
		    wormgone(mtmp);
		} else num_segs = 0;

		/* set minvent's obj->no_charge to 0 */
		for (obj = mtmp->minvent; obj; obj = obj->nobj) {
		    if (Has_contents(obj))
			picked_container(obj);	/* does the right thing */
		    obj->no_charge = 0;
		}

		relmon(mtmp);
		newsym(mtmp->mx,mtmp->my);
		mtmp->mx = mtmp->my = 0; /* avoid mnexto()/MON_AT() problem */
		mtmp->wormno = num_segs;
		mtmp->mlstmv = moves;
		mtmp->nmon = mydogs;
		mydogs = mtmp;
	    } else if (mtmp->iswiz) {
		/* we want to be able to find him when his next resurrection
		   chance comes up, but have him resume his present location
		   if player returns to this level before that time */
		migrate_to_level(mtmp, ledger_no(&u.uz),
				 MIGR_EXACT_XY, NULL);
	    } else if (mtmp->mleashed) {
		/* this can happen if your quest leader ejects you from the
		   "home" level while a leashed pet isn't next to you */
		pline("%s leash goes slack.", s_suffix(Monnam(mtmp)));
		m_unleash(mtmp, FALSE);
	    }
	}
}